

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O2

QCborMap __thiscall QCborMap::fromVariantHash(QCborMap *this,QVariantHash *hash)

{
  QCborContainerPrivate *this_00;
  Span *pSVar1;
  ulong uVar2;
  size_t reserved;
  long in_FS_OFFSET;
  piter local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d.ptr = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QCborMap(this);
  if (hash->d == (Data *)0x0) {
    reserved = 0;
  }
  else {
    reserved = hash->d->size;
  }
  detach(this,reserved);
  this_00 = (this->d).d.ptr;
  local_30 = (piter)QHash<QString,_QVariant>::begin(hash);
  while( true ) {
    if (local_30.d == (Data<QHashPrivate::Node<QString,_QVariant>_> *)0x0 && local_30.bucket == 0)
    break;
    pSVar1 = (local_30.d)->spans;
    uVar2 = local_30.bucket >> 7;
    QCborContainerPrivate::append
              (this_00,(QString *)
                       (pSVar1[uVar2].entries + pSVar1[uVar2].offsets[(uint)local_30.bucket & 0x7f])
              );
    appendVariant(this_00,(QVariant *)
                          ((local_30.d)->spans[local_30.bucket >> 7].entries
                           [(local_30.d)->spans[local_30.bucket >> 7].offsets
                            [(uint)local_30.bucket & 0x7f]].storage.data + 0x18));
    QHashPrivate::iterator<QHashPrivate::Node<QString,_QVariant>_>::operator++(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QCborMap QCborMap::fromVariantHash(const QVariantHash &hash)
{
    QCborMap m;
    m.detach(hash.size());
    QCborContainerPrivate *d = m.d.data();

    auto it = hash.begin();
    auto end = hash.end();
    for ( ; it != end; ++it) {
        d->append(it.key());
        appendVariant(d, it.value());
    }
    return m;
}